

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hpp
# Opt level: O0

void __thiscall VariableSymbol::~VariableSymbol(VariableSymbol *this)

{
  Symbol *in_RDI;
  
  in_RDI->_vptr_Symbol = (_func_int **)&PTR__VariableSymbol_001adef0;
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  Symbol::~Symbol(in_RDI);
  return;
}

Assistant:

VariableSymbol(const std::string& name, const TypeName& type):
    name_(name), type_(type) {}